

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_compiler.hpp
# Opt level: O0

escape_value __thiscall
boost::xpressive::
regex_compiler<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>
::parse_escape<char_const*>
          (regex_compiler<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
           *this,char **begin,char *end)

{
  undefined1 auVar1 [16];
  int iVar2;
  char *in_RDX;
  compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
  *in_RSI;
  char *in_RDI;
  escape_value<char,_unsigned_short> eVar3;
  escape_value eVar4;
  int mark_nbr;
  char *tmp;
  escape_value esc;
  char *in_stack_00000048;
  error_type in_stack_00000050;
  bool in_stack_00000057;
  int in_stack_00000198;
  char_type in_stack_0000019f;
  cpp_regex_traits<char> *in_stack_000001a0;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *tr;
  char *end_00;
  escape_value local_10;
  escape_type eStack_4;
  undefined8 uVar5;
  
  auVar1 = (undefined1  [16])local_10;
  end_00 = in_RDI;
  detail::ensure_(in_stack_00000057,in_stack_00000050,in_stack_00000048,(char *)esc._8_8_,
                  (char *)esc._0_8_,(unsigned_long)this);
  regex_compiler<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
  ::rxtraits((regex_compiler<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
              *)0x147ab6);
  iVar2 = cpp_regex_traits<char>::value(in_stack_000001a0,in_stack_0000019f,in_stack_00000198);
  if (0 < iVar2) {
    tr = *(regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> **)
          (in_RSI->traits_).super_cpp_regex_traits<char>.super_cpp_regex_traits_base<char,_1UL>.
          masks_;
    regex_compiler<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
    ::rxtraits((regex_compiler<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
                *)0x147afa);
    iVar2 = detail::
            toi<char_const*,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
                      ((char **)in_RSI,in_RDX,tr,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8
                      );
    if ((iVar2 < 10) || (iVar2 <= (int)*(undefined8 *)in_RDI)) {
      *(regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> **)
       (in_RSI->traits_).super_cpp_regex_traits<char>.super_cpp_regex_traits_base<char,_1UL>.masks_
           = tr;
      local_10._0_4_ = local_10._1_4_ << 8;
      local_10.mark_nbr_ = iVar2;
      local_10._10_6_ = auVar1._10_6_;
      local_10.class_ = 0;
      eStack_4 = escape_mark;
      return local_10;
    }
  }
  eVar3 = detail::
          parse_escape<char_const*,boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>
                    (local_10._0_8_,end_00,in_RSI);
  eVar4.ch_ = eVar3.ch_;
  eVar4._1_3_ = eVar3._1_3_;
  eVar4.mark_nbr_ = eVar3.mark_nbr_;
  register0x00000010 = eVar3.class_;
  register0x00000012 = eVar3._10_2_;
  register0x00000014 = eVar3.type_;
  return eVar4;
}

Assistant:

escape_value parse_escape(FwdIter &begin, FwdIter end)
    {
        BOOST_XPR_ENSURE_(begin != end, regex_constants::error_escape, "incomplete escape sequence");

        // first, check to see if this can be a backreference
        if(0 < this->rxtraits().value(*begin, 10))
        {
            // Parse at most 3 decimal digits.
            FwdIter tmp = begin;
            int mark_nbr = detail::toi(tmp, end, this->rxtraits(), 10, 999);

            // If the resulting number could conceivably be a backref, then it is.
            if(10 > mark_nbr || mark_nbr <= static_cast<int>(this->mark_count_))
            {
                begin = tmp;
                escape_value esc = {0, mark_nbr, 0, detail::escape_mark};
                return esc;
            }
        }

        // Not a backreference, defer to the parse_escape helper
        return detail::parse_escape(begin, end, this->traits_);
    }